

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O2

void PixelToaster::convert_XBGRFFFF_to_BGR888(Pixel *source,integer8 *destination,uint count)

{
  integer8 iVar1;
  long lVar2;
  float fVar3;
  integer8 iVar4;
  Pixel *pPVar5;
  float fVar6;
  float fVar7;
  
  pPVar5 = source + 8;
  for (lVar2 = 0; (ulong)count * 3 != lVar2; lVar2 = lVar2 + 3) {
    fVar6 = (float)(~((int)*(uint *)(pPVar5 + -8) >> 0x1f) & *(uint *)(pPVar5 + -8));
    fVar3 = (float)(~((int)*(uint *)(pPVar5 + -4) >> 0x1f) & *(uint *)(pPVar5 + -4));
    fVar7 = (float)(~((int)*(uint *)pPVar5 >> 0x1f) & *(uint *)pPVar5);
    iVar4 = (integer8)((uint)(fVar7 + 1.0) >> 0xf);
    if (0x3f7ffffe < (int)fVar7) {
      iVar4 = 0xff;
    }
    iVar1 = (integer8)((uint)(fVar3 + 1.0) >> 0xf);
    if (0x3f7ffffe < (int)fVar3) {
      iVar1 = 0xff;
    }
    destination[lVar2] = iVar4;
    iVar4 = (integer8)((uint)(fVar6 + 1.0) >> 0xf);
    if (0x3f7ffffe < (int)fVar6) {
      iVar4 = 0xff;
    }
    destination[lVar2 + 1] = iVar1;
    destination[lVar2 + 2] = iVar4;
    pPVar5 = pPVar5 + 0x10;
  }
  return;
}

Assistant:

inline void convert_XBGRFFFF_to_BGR888(const Pixel source[], integer8 destination[], unsigned int count)
{
    for (unsigned int i = 0; i < count; ++i)
    {
        const integer32 r = clamped_fraction_8(source[i].r) >> 15;
        const integer32 g = clamped_fraction_8(source[i].g) >> 15;
        const integer32 b = clamped_fraction_8(source[i].b) >> 15;

        destination[0] = (integer8)b;
        destination[1] = (integer8)g;
        destination[2] = (integer8)r;

        destination += 3;
    }
}